

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SphereLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,SphereLight *light
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  uint uVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *this;
  _Rb_tree_node_base *p_Var6;
  Property *pPVar7;
  _Rb_tree_node_base *p_Var8;
  char *pcVar9;
  string *psVar10;
  int iVar11;
  Property *pPVar12;
  allocator local_361;
  string *local_360;
  Property *local_358;
  string *local_350;
  undefined4 local_344;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_340;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_338;
  string local_330;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  ostringstream ss_e;
  code *local_258 [45];
  _Any_data local_f0;
  code *local_e0;
  _Any_data local_d0;
  code *local_c0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = ReconstructXformOpsFromProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar2) {
    p_Var6 = (_Rb_tree_node_base *)&(light->super_BoundableLight).purpose;
    local_338 = &(light->super_BoundableLight).visibility;
    p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360 = err;
    local_350 = warn;
    local_340 = (TypedAttributeWithFallback<tinyusdz::Purpose> *)p_Var6;
    while( true ) {
      bVar2 = (_Rb_tree_header *)p_Var8 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      local_344 = (undefined4)CONCAT71((int7)((ulong)p_Var6 >> 8),bVar2);
      if (bVar2) break;
      pPVar12 = (Property *)(p_Var8 + 1);
      ::std::__cxx11::string::string((string *)&local_50,(string *)pPVar12);
      pPVar7 = (Property *)(p_Var8 + 2);
      psVar10 = (string *)&ss_e;
      ::std::__cxx11::string::string((string *)psVar10,"inputs:color",(allocator *)&local_330);
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                (&ret,&table,&local_50,pPVar7,psVar10,&(light->super_BoundableLight).color);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar11 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar2 = false;
        iVar11 = 3;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          local_358 = pPVar12;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc8d);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_361);
          fmt::format<char[13],std::__cxx11::string>
                    (&local_330,(fmt *)&local_288,(string *)"inputs:color",(char (*) [13])&ret.err,
                     psVar10);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_330);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar10 = local_360;
          if (local_360 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_330,&local_288,psVar10);
            ::std::__cxx11::string::operator=((string *)psVar10,(string *)&local_330);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar2 = false;
          iVar11 = 1;
          pPVar12 = local_358;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)pPVar12);
        psVar10 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar10,"inputs:radius",(allocator *)&local_330);
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_70,pPVar7,psVar10,&light->radius);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar11 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar11 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_358 = pPVar12;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc8e);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_361);
            fmt::format<char[14],std::__cxx11::string>
                      (&local_330,(fmt *)&local_288,(string *)"inputs:radius",
                       (char (*) [14])&ret.err,psVar10);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_330);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar10 = local_360;
            if (local_360 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_330,&local_288,psVar10);
              ::std::__cxx11::string::operator=((string *)psVar10,(string *)&local_330);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar11 = 1;
            pPVar12 = local_358;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b6a0b;
        ::std::__cxx11::string::string((string *)&local_90,(string *)pPVar12);
        psVar10 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar10,"inputs:intensity",(allocator *)&local_330)
        ;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_90,pPVar7,psVar10,&(light->super_BoundableLight).intensity);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar11 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar11 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_358 = pPVar12;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc90);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_361);
            fmt::format<char[17],std::__cxx11::string>
                      (&local_330,(fmt *)&local_288,(string *)"inputs:intensity",
                       (char (*) [17])&ret.err,psVar10);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_330);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar10 = local_360;
            if (local_360 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_330,&local_288,psVar10);
              ::std::__cxx11::string::operator=((string *)psVar10,(string *)&local_330);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar11 = 1;
            pPVar12 = local_358;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b6a0b;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pPVar12,"visibility");
        if (bVar2) {
          ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
          sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar5 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,pPVar7);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var3) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc92);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar4 = ::std::operator<<(poVar4,"visibility");
                poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
                ::std::operator<<(poVar4,"\n");
                psVar10 = local_350;
                if (local_350 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,&local_330,local_360);
                  ::std::__cxx11::string::operator=((string *)psVar10,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_338->_metas,(AttrMetas *)(p_Var8 + 7));
                pcVar9 = "visibility";
LAB_001b64c3:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar9,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001b6a16;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = VisibilityEnumHandler;
            local_258[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_330);
            bVar2 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_d0,
                       (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            bVar2 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              ((string *)&ret,bVar2,
                               (EnumHandlerFun<tinyusdz::Visibility> *)&local_d0,(Attribute *)pPVar7
                               ,local_338,local_350,local_360);
            if (local_c0 != (code *)0x0) {
              (*local_c0)(&local_d0,&local_d0,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar11 = 1;
            if (bVar2) {
              AttrMetas::operator=(&local_338->_metas,(AttrMetas *)(p_Var8 + 7));
              pcVar9 = "visibility";
LAB_001b69c8:
              ::std::__cxx11::string::string((string *)&ret,pcVar9,(allocator *)&local_330);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar11 = 3;
            }
LAB_001b69ee:
            if (local_258[0] != (code *)0x0) {
              (*local_258[0])(&ss_e,&ss_e,3);
            }
            goto LAB_001b6a0b;
          }
        }
        else {
          local_358 = pPVar7;
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pPVar12,"purpose");
          if (bVar2) {
            ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            pPVar12 = local_358;
            if (sVar5 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,local_358);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var3 = ::std::operator==((string *)&ss_e,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ret);
              if ((_Var3) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar4 = ::std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar4 = ::std::operator<<(poVar4,":");
                  poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                  poVar4 = ::std::operator<<(poVar4,"():");
                  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc94);
                  ::std::operator<<(poVar4," ");
                  poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar4 = ::std::operator<<(poVar4,"purpose");
                  poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar4,"\n");
                  psVar10 = local_350;
                  if (local_350 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,&local_330,local_360);
                    ::std::__cxx11::string::operator=((string *)psVar10,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var8 + 7));
                  pcVar9 = "purpose";
                  goto LAB_001b64c3;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = PurposeEnumHandler;
              local_258[0] = ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_330);
              bVar2 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_f0,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              bVar2 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)&ret,bVar2,(EnumHandlerFun<tinyusdz::Purpose> *)&local_f0
                                 ,&pPVar12->_attrib,local_340,local_350,local_360);
              if (local_e0 != (code *)0x0) {
                (*local_e0)(&local_f0,&local_f0,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar11 = 1;
              if (bVar2) {
                AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var8 + 7));
                pcVar9 = "purpose";
                goto LAB_001b69c8;
              }
              goto LAB_001b69ee;
            }
          }
          else {
            ::std::__cxx11::string::string((string *)&local_b0,(string *)pPVar12);
            ::std::__cxx11::string::string((string *)&ss_e,"extent",(allocator *)&local_330);
            pPVar7 = local_358;
            anon_unknown_0::ParseExtentAttribute
                      (&ret,&table,&local_b0,local_358,(key_type *)&ss_e,
                       &(light->super_BoundableLight).extent);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar11 = 0;
            if ((ret.code & ~AlreadyProcessed) == Success) {
              bVar2 = false;
              iVar11 = 3;
            }
            else {
              bVar2 = true;
              if (ret.code != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc95);
                ::std::operator<<(poVar4," ");
                ::std::__cxx11::string::string
                          ((string *)&local_288,"Parsing attribute `extent` failed. Error: {}",
                           &local_361);
                fmt::format<std::__cxx11::string>
                          ((string *)&local_330,(fmt *)&local_288,(string *)&ret.err,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar7);
                poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_330);
                ::std::operator<<(poVar4,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                psVar10 = local_360;
                if (local_360 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_330,&local_288,psVar10);
                  ::std::__cxx11::string::operator=((string *)psVar10,(string *)&local_330);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                bVar2 = false;
                iVar11 = 1;
              }
            }
            ::std::__cxx11::string::_M_dispose();
            pPVar7 = local_358;
            if (!bVar2) goto LAB_001b6a0b;
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)pPVar12);
            if (sVar5 == 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](&(light->super_BoundableLight).props,(key_type *)pPVar12);
              Property::operator=(this,pPVar7);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar12);
            }
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)pPVar12);
            if (sVar5 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc97);
              ::std::operator<<(poVar4," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar12);
              poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::string::_M_dispose();
              psVar10 = local_350;
              if (local_350 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,&local_330,local_360);
                ::std::__cxx11::string::operator=((string *)psVar10,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
          }
        }
      }
      else {
LAB_001b6a0b:
        if ((iVar11 != 3) && (iVar11 != 0)) break;
      }
LAB_001b6a16:
      p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var8);
      p_Var8 = p_Var6;
    }
  }
  else {
    local_344 = 0;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return SUB41(local_344,0);
}

Assistant:

bool ReconstructPrim<SphereLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SphereLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;

  (void)options;
  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", SphereLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", SphereLight, light->radius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", SphereLight,
                   light->intensity)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, SphereLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, SphereLight,
                       light->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, SphereLight, light->extent)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}